

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

void TestDoubleToFixed(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  char buffer [128];
  undefined8 in_stack_fffffffffffffd98;
  undefined4 uVar9;
  undefined8 uVar7;
  byte *pbVar8;
  StringBuilder local_260;
  DoubleToStringConverter local_248;
  DoubleToStringConverter local_218;
  DoubleToStringConverter local_1e8;
  DoubleToStringConverter local_1b8;
  DoubleToStringConverter local_188;
  DoubleToStringConverter local_158;
  DoubleToStringConverter local_128;
  DoubleToStringConverter local_f8;
  DoubleToStringConverter local_c8;
  byte local_98 [128];
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_260.buffer_.start_ = (char *)local_98;
  local_260.buffer_.length_ = 0x80;
  local_260.position_ = 0;
  local_248.flags_ = 9;
  local_248.infinity_symbol_ = "Infinity";
  local_248.nan_symbol_ = "NaN";
  local_248.exponent_character_ = 'e';
  local_248.decimal_in_shortest_low_ = 0;
  local_248.decimal_in_shortest_high_ = 0;
  local_248.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_248.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_248.min_exponent_width_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.0,0,&local_260);
  if (!bVar1) {
    pcVar4 = "dc.ToFixed(0.0, 0, &builder)";
    uVar5 = 0x1c1;
    goto LAB_00830c85;
  }
  local_260.buffer_.start_[local_260.position_] = 0;
  local_260.position_ = -1;
  if ((byte *)local_260.buffer_.start_ == (byte *)0x0) {
LAB_0082fc59:
    local_260.position_ = -1;
    abort();
  }
  uVar3 = (byte)*local_260.buffer_.start_ - 0x30;
  if (uVar3 == 0) {
    uVar3 = (uint)(byte)local_260.buffer_.start_[1];
  }
  if (uVar3 != 0) {
    pcVar4 = "\"0\"";
    pcVar6 = "0";
    uVar5 = 0x1c2;
    pbVar8 = (byte *)local_260.buffer_.start_;
LAB_00830cbd:
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar5,pcVar4,"builder.Finalize()",pcVar6,pbVar8);
    abort();
  }
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,-0.0,0,&local_260);
  if (!bVar1) {
    pcVar4 = "dc.ToFixed(-0.0, 0, &builder)";
    uVar5 = 0x1c5;
    goto LAB_00830c85;
  }
  local_260.buffer_.start_[local_260.position_] = 0;
  local_260.position_ = -1;
  if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
  uVar3 = (byte)*local_260.buffer_.start_ - 0x30;
  if (uVar3 == 0) {
    uVar3 = (uint)(byte)local_260.buffer_.start_[1];
  }
  if (uVar3 != 0) {
    pcVar4 = "\"0\"";
    pcVar6 = "0";
    uVar5 = 0x1c6;
    pbVar8 = (byte *)local_260.buffer_.start_;
    goto LAB_00830cbd;
  }
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,-0.0,1,&local_260);
  pbVar8 = (byte *)local_260.buffer_.start_;
  if (!bVar1) {
    pcVar4 = "dc.ToFixed(-0.0, 1, &builder)";
    uVar5 = 0x1c9;
    goto LAB_00830c85;
  }
  local_260.buffer_.start_[local_260.position_] = 0;
  local_260.position_ = -1;
  if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
  iVar2 = strcmp("0.0",local_260.buffer_.start_);
  if (iVar2 != 0) {
    pcVar4 = "\"0.0\"";
    pcVar6 = "0.0";
    uVar5 = 0x1ca;
    goto LAB_00830cbd;
  }
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,-0.0,1,&local_260);
  pbVar8 = (byte *)local_260.buffer_.start_;
  if (!bVar1) {
    pcVar4 = "dc.ToFixed(-0.0, 1, &builder)";
    uVar5 = 0x1cd;
    goto LAB_00830c85;
  }
  local_260.buffer_.start_[local_260.position_] = 0;
  local_260.position_ = -1;
  if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
  iVar2 = strcmp("0.0",local_260.buffer_.start_);
  if (iVar2 != 0) {
    pcVar4 = "\"0.0\"";
    pcVar6 = "0.0";
    uVar5 = 0x1ce;
    goto LAB_00830cbd;
  }
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,0.0,0x3c,&local_260);
  pbVar8 = (byte *)local_260.buffer_.start_;
  if (!bVar1) {
    pcVar4 = "dc.ToFixed( 0.0, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder)";
    uVar5 = 0x1d4;
    goto LAB_00830c85;
  }
  local_260.buffer_.start_[local_260.position_] = 0;
  local_260.position_ = -1;
  if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
  iVar2 = strcmp("0.000000000000000000000000000000000000000000000000000000000000",
                 local_260.buffer_.start_);
  if (iVar2 != 0) {
    pcVar4 = "\"0.000000000000000000000000000000000000000000000000000000000000\"";
    pcVar6 = "0.000000000000000000000000000000000000000000000000000000000000";
    uVar5 = 0x1d6;
    goto LAB_00830cbd;
  }
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,9e+59,0x3c,&local_260);
  pbVar8 = (byte *)local_260.buffer_.start_;
  if (!bVar1) {
    pcVar4 = "dc.ToFixed( 9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder)";
    uVar5 = 0x1da;
    goto LAB_00830c85;
  }
  local_260.buffer_.start_[local_260.position_] = 0;
  local_260.position_ = -1;
  if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
  iVar2 = strcmp("899999999999999918767229449717619953810131273674690656206848.000000000000000000000000000000000000000000000000000000000000"
                 ,local_260.buffer_.start_);
  if (iVar2 != 0) {
    pcVar4 = 
    "\"899999999999999918767229449717619953810131273674690656206848.\" \"000000000000000000000000000000000000000000000000000000000000\""
    ;
    pcVar6 = 
    "899999999999999918767229449717619953810131273674690656206848.000000000000000000000000000000000000000000000000000000000000"
    ;
    uVar5 = 0x1dd;
    goto LAB_00830cbd;
  }
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,-9e+59,0x3c,&local_260);
  pbVar8 = (byte *)local_260.buffer_.start_;
  if (!bVar1) {
    pcVar4 = "dc.ToFixed( -9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder)";
    uVar5 = 0x1e1;
    goto LAB_00830c85;
  }
  local_260.buffer_.start_[local_260.position_] = 0;
  local_260.position_ = -1;
  if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
  iVar2 = strcmp("-899999999999999918767229449717619953810131273674690656206848.000000000000000000000000000000000000000000000000000000000000"
                 ,local_260.buffer_.start_);
  if (iVar2 != 0) {
    pcVar4 = 
    "\"-899999999999999918767229449717619953810131273674690656206848.\" \"000000000000000000000000000000000000000000000000000000000000\""
    ;
    pcVar6 = 
    "-899999999999999918767229449717619953810131273674690656206848.000000000000000000000000000000000000000000000000000000000000"
    ;
    uVar5 = 0x1e4;
    goto LAB_00830cbd;
  }
  local_260.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,1e+60,0x3c,&local_260);
  if (bVar1) {
    pcVar4 = "!dc.ToFixed( 1e60, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder)";
    uVar5 = 0x1e8;
  }
  else {
    if (local_260.position_ != 0) {
      uVar7 = CONCAT44(uVar9,local_260.position_);
      uVar5 = 0x1e9;
LAB_0082ff16:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
             ,uVar5,"0","builder.position()",0,uVar7);
      abort();
    }
    bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,9e+59,0x3d,&local_260);
    if (bVar1) {
      pcVar4 = 
      "!dc.ToFixed( 9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint + 1, &builder)";
      uVar5 = 0x1ed;
    }
    else {
      if (local_260.position_ != 0) {
        uVar7 = CONCAT44(uVar9,local_260.position_);
        uVar5 = 0x1ee;
        goto LAB_0082ff16;
      }
      bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,3.0,0,&local_260);
      if (bVar1) {
        local_260.buffer_.start_[local_260.position_] = 0;
        local_260.position_ = -1;
        if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
        uVar3 = (byte)*local_260.buffer_.start_ - 0x33;
        if (uVar3 == 0) {
          uVar3 = (uint)(byte)local_260.buffer_.start_[1];
        }
        if (uVar3 != 0) {
          pcVar4 = "\"3\"";
          pcVar6 = "3";
          uVar5 = 0x1f2;
          pbVar8 = (byte *)local_260.buffer_.start_;
          goto LAB_00830cbd;
        }
        local_260.position_ = 0;
        bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,3.23,1,&local_260);
        pbVar8 = (byte *)local_260.buffer_.start_;
        if (bVar1) {
          local_260.buffer_.start_[local_260.position_] = 0;
          local_260.position_ = -1;
          if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
          iVar2 = strcmp("3.2",local_260.buffer_.start_);
          if (iVar2 != 0) {
            pcVar4 = "\"3.2\"";
            pcVar6 = "3.2";
            uVar5 = 0x1f6;
            goto LAB_00830cbd;
          }
          local_260.position_ = 0;
          bVar1 = double_conversion::DoubleToStringConverter::ToFixed(&local_248,3.23,3,&local_260);
          pbVar8 = (byte *)local_260.buffer_.start_;
          if (bVar1) {
            local_260.buffer_.start_[local_260.position_] = 0;
            local_260.position_ = -1;
            if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
            iVar2 = strcmp("3.230",local_260.buffer_.start_);
            if (iVar2 != 0) {
              pcVar4 = "\"3.230\"";
              pcVar6 = "3.230";
              uVar5 = 0x1fa;
              goto LAB_00830cbd;
            }
            local_260.position_ = 0;
            bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                              (&local_248,0.0323,2,&local_260);
            pbVar8 = (byte *)local_260.buffer_.start_;
            if (bVar1) {
              local_260.buffer_.start_[local_260.position_] = 0;
              local_260.position_ = -1;
              if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
              iVar2 = strcmp("0.03",local_260.buffer_.start_);
              if (iVar2 != 0) {
                pcVar4 = "\"0.03\"";
                pcVar6 = "0.03";
                uVar5 = 0x1fe;
                goto LAB_00830cbd;
              }
              local_260.position_ = 0;
              bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                (&local_248,0.0373,2,&local_260);
              pbVar8 = (byte *)local_260.buffer_.start_;
              if (bVar1) {
                local_260.buffer_.start_[local_260.position_] = 0;
                local_260.position_ = -1;
                if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
                iVar2 = strcmp("0.04",local_260.buffer_.start_);
                if (iVar2 != 0) {
                  pcVar4 = "\"0.04\"";
                  pcVar6 = "0.04";
                  uVar5 = 0x202;
                  goto LAB_00830cbd;
                }
                local_260.position_ = 0;
                bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                  (&local_248,3.73e-05,2,&local_260);
                pbVar8 = (byte *)local_260.buffer_.start_;
                if (bVar1) {
                  local_260.buffer_.start_[local_260.position_] = 0;
                  local_260.position_ = -1;
                  if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
                  iVar2 = strcmp("0.00",local_260.buffer_.start_);
                  if (iVar2 != 0) {
                    pcVar4 = "\"0.00\"";
                    pcVar6 = "0.00";
                    uVar5 = 0x206;
                    goto LAB_00830cbd;
                  }
                  local_260.position_ = 0;
                  bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                    (&local_248,1.5,0,&local_260);
                  if (bVar1) {
                    local_260.buffer_.start_[local_260.position_] = 0;
                    local_260.position_ = -1;
                    if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
                    uVar3 = (byte)*local_260.buffer_.start_ - 0x32;
                    if (uVar3 == 0) {
                      uVar3 = (uint)(byte)local_260.buffer_.start_[1];
                    }
                    if (uVar3 != 0) {
                      pcVar4 = "\"2\"";
                      pcVar6 = "2";
                      uVar5 = 0x20a;
                      pbVar8 = (byte *)local_260.buffer_.start_;
                      goto LAB_00830cbd;
                    }
                    local_260.position_ = 0;
                    bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                      (&local_248,2.5,0,&local_260);
                    if (bVar1) {
                      local_260.buffer_.start_[local_260.position_] = 0;
                      local_260.position_ = -1;
                      if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
                      uVar3 = (byte)*local_260.buffer_.start_ - 0x33;
                      if (uVar3 == 0) {
                        uVar3 = (uint)(byte)local_260.buffer_.start_[1];
                      }
                      if (uVar3 != 0) {
                        pcVar4 = "\"3\"";
                        pcVar6 = "3";
                        uVar5 = 0x20e;
                        pbVar8 = (byte *)local_260.buffer_.start_;
                        goto LAB_00830cbd;
                      }
                      local_260.position_ = 0;
                      bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                        (&local_248,3.5,0,&local_260);
                      if (bVar1) {
                        local_260.buffer_.start_[local_260.position_] = 0;
                        local_260.position_ = -1;
                        if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
                        uVar3 = (byte)*local_260.buffer_.start_ - 0x34;
                        if (uVar3 == 0) {
                          uVar3 = (uint)(byte)local_260.buffer_.start_[1];
                        }
                        if (uVar3 != 0) {
                          pcVar4 = "\"4\"";
                          pcVar6 = "4";
                          uVar5 = 0x212;
                          pbVar8 = (byte *)local_260.buffer_.start_;
                          goto LAB_00830cbd;
                        }
                        local_260.position_ = 0;
                        bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                          (&local_248,0.15,1,&local_260);
                        pbVar8 = (byte *)local_260.buffer_.start_;
                        if (bVar1) {
                          local_260.buffer_.start_[local_260.position_] = 0;
                          local_260.position_ = -1;
                          if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
                          iVar2 = strcmp("0.1",local_260.buffer_.start_);
                          if (iVar2 != 0) {
                            pcVar4 = "\"0.1\"";
                            pcVar6 = "0.1";
                            uVar5 = 0x216;
                            goto LAB_00830cbd;
                          }
                          local_260.position_ = 0;
                          bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                            (&local_248,0.25,1,&local_260);
                          pbVar8 = (byte *)local_260.buffer_.start_;
                          if (bVar1) {
                            local_260.buffer_.start_[local_260.position_] = 0;
                            local_260.position_ = -1;
                            if ((byte *)local_260.buffer_.start_ == (byte *)0x0) goto LAB_0082fc59;
                            iVar2 = strcmp("0.3",local_260.buffer_.start_);
                            if (iVar2 != 0) {
                              pcVar4 = "\"0.3\"";
                              pcVar6 = "0.3";
                              uVar5 = 0x21a;
                              goto LAB_00830cbd;
                            }
                            local_260.position_ = 0;
                            bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                              (&local_248,0.35,1,&local_260);
                            pbVar8 = (byte *)local_260.buffer_.start_;
                            if (bVar1) {
                              local_260.buffer_.start_[local_260.position_] = 0;
                              local_260.position_ = -1;
                              if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                              goto LAB_0082fc59;
                              iVar2 = strcmp("0.3",local_260.buffer_.start_);
                              if (iVar2 != 0) {
                                pcVar4 = "\"0.3\"";
                                pcVar6 = "0.3";
                                uVar5 = 0x21e;
                                goto LAB_00830cbd;
                              }
                              local_260.position_ = 0;
                              bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                                (&local_248,0.45,1,&local_260);
                              pbVar8 = (byte *)local_260.buffer_.start_;
                              if (bVar1) {
                                local_260.buffer_.start_[local_260.position_] = 0;
                                local_260.position_ = -1;
                                if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                goto LAB_0082fc59;
                                iVar2 = strcmp("0.5",local_260.buffer_.start_);
                                if (iVar2 != 0) {
                                  pcVar4 = "\"0.5\"";
                                  pcVar6 = "0.5";
                                  uVar5 = 0x222;
                                  goto LAB_00830cbd;
                                }
                                local_260.position_ = 0;
                                bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                                  (&local_248,0.55,1,&local_260);
                                pbVar8 = (byte *)local_260.buffer_.start_;
                                if (bVar1) {
                                  local_260.buffer_.start_[local_260.position_] = 0;
                                  local_260.position_ = -1;
                                  if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                  goto LAB_0082fc59;
                                  iVar2 = strcmp("0.6",local_260.buffer_.start_);
                                  if (iVar2 != 0) {
                                    pcVar4 = "\"0.6\"";
                                    pcVar6 = "0.6";
                                    uVar5 = 0x226;
                                    goto LAB_00830cbd;
                                  }
                                  local_c8.flags_ = 1;
                                  local_c8.infinity_symbol_ = "Infinity";
                                  local_c8.nan_symbol_ = "NaN";
                                  local_c8.exponent_character_ = 'e';
                                  local_c8.decimal_in_shortest_low_ = 0;
                                  local_c8.decimal_in_shortest_high_ = 0;
                                  local_c8.max_leading_padding_zeroes_in_precision_mode_ = 0;
                                  local_c8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
                                  local_c8.min_exponent_width_ = 0;
                                  local_260.position_ = 0;
                                  bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                                    (&local_c8,0.0,1,&local_260);
                                  pbVar8 = (byte *)local_260.buffer_.start_;
                                  if (bVar1) {
                                    local_260.buffer_.start_[local_260.position_] = 0;
                                    local_260.position_ = -1;
                                    if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                    goto LAB_0082fc59;
                                    iVar2 = strcmp("0.0",local_260.buffer_.start_);
                                    if (iVar2 != 0) {
                                      pcVar4 = "\"0.0\"";
                                      pcVar6 = "0.0";
                                      uVar5 = 0x22e;
                                      goto LAB_00830cbd;
                                    }
                                    local_260.position_ = 0;
                                    bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                                      (&local_c8,-0.0,1,&local_260);
                                    pbVar8 = (byte *)local_260.buffer_.start_;
                                    if (bVar1) {
                                      local_260.buffer_.start_[local_260.position_] = 0;
                                      local_260.position_ = -1;
                                      if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                      goto LAB_0082fc59;
                                      iVar2 = strcmp("-0.0",local_260.buffer_.start_);
                                      if (iVar2 != 0) {
                                        pcVar4 = "\"-0.0\"";
                                        pcVar6 = "-0.0";
                                        uVar5 = 0x232;
                                        goto LAB_00830cbd;
                                      }
                                      local_158.flags_ = 3;
                                      local_158.infinity_symbol_ = "Infinity";
                                      local_158.nan_symbol_ = "NaN";
                                      local_158.exponent_character_ = 'e';
                                      local_158.decimal_in_shortest_low_ = 0;
                                      local_158.decimal_in_shortest_high_ = 0;
                                      local_158.max_leading_padding_zeroes_in_precision_mode_ = 0;
                                      local_158.max_trailing_padding_zeroes_in_precision_mode_ = 0;
                                      local_158.min_exponent_width_ = 0;
                                      local_260.position_ = 0;
                                      bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                                        (&local_158,0.0,0,&local_260);
                                      if (bVar1) {
                                        local_260.buffer_.start_[local_260.position_] = 0;
                                        local_260.position_ = -1;
                                        if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                        goto LAB_0082fc59;
                                        uVar3 = (byte)*local_260.buffer_.start_ - 0x30;
                                        if ((uVar3 == 0) &&
                                           (uVar3 = (byte)local_260.buffer_.start_[1] - 0x2e,
                                           uVar3 == 0)) {
                                          uVar3 = (uint)(byte)local_260.buffer_.start_[2];
                                        }
                                        if (uVar3 != 0) {
                                          pcVar4 = "\"0.\"";
                                          pcVar6 = "0.";
                                          uVar5 = 0x23b;
                                          pbVar8 = (byte *)local_260.buffer_.start_;
                                          goto LAB_00830cbd;
                                        }
                                        local_260.position_ = 0;
                                        bVar1 = double_conversion::DoubleToStringConverter::ToFixed
                                                          (&local_158,-0.0,0,&local_260);
                                        pbVar8 = (byte *)local_260.buffer_.start_;
                                        if (bVar1) {
                                          local_260.buffer_.start_[local_260.position_] = 0;
                                          local_260.position_ = -1;
                                          if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                          goto LAB_0082fc59;
                                          iVar2 = strcmp("-0.",local_260.buffer_.start_);
                                          if (iVar2 != 0) {
                                            pcVar4 = "\"-0.\"";
                                            pcVar6 = "-0.";
                                            uVar5 = 0x23f;
                                            goto LAB_00830cbd;
                                          }
                                          local_260.position_ = 0;
                                          bVar1 = double_conversion::DoubleToStringConverter::
                                                  ToFixed(&local_158,1.0,0,&local_260);
                                          if (bVar1) {
                                            local_260.buffer_.start_[local_260.position_] = 0;
                                            local_260.position_ = -1;
                                            if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                            goto LAB_0082fc59;
                                            uVar3 = (byte)*local_260.buffer_.start_ - 0x31;
                                            if ((uVar3 == 0) &&
                                               (uVar3 = (byte)local_260.buffer_.start_[1] - 0x2e,
                                               uVar3 == 0)) {
                                              uVar3 = (uint)(byte)local_260.buffer_.start_[2];
                                            }
                                            if (uVar3 != 0) {
                                              pcVar4 = "\"1.\"";
                                              pcVar6 = "1.";
                                              uVar5 = 0x243;
                                              pbVar8 = (byte *)local_260.buffer_.start_;
                                              goto LAB_00830cbd;
                                            }
                                            local_260.position_ = 0;
                                            bVar1 = double_conversion::DoubleToStringConverter::
                                                    ToFixed(&local_158,-1.0,0,&local_260);
                                            pbVar8 = (byte *)local_260.buffer_.start_;
                                            if (bVar1) {
                                              local_260.buffer_.start_[local_260.position_] = 0;
                                              local_260.position_ = -1;
                                              if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                              goto LAB_0082fc59;
                                              iVar2 = strcmp("-1.",local_260.buffer_.start_);
                                              if (iVar2 != 0) {
                                                pcVar4 = "\"-1.\"";
                                                pcVar6 = "-1.";
                                                uVar5 = 0x247;
                                                goto LAB_00830cbd;
                                              }
                                              local_188.flags_ = 7;
                                              local_188.infinity_symbol_ = "Infinity";
                                              local_188.nan_symbol_ = "NaN";
                                              local_188.exponent_character_ = 'e';
                                              local_188.decimal_in_shortest_low_ = 0;
                                              local_188.decimal_in_shortest_high_ = 0;
                                              local_188.
                                              max_leading_padding_zeroes_in_precision_mode_ = 0;
                                              local_188.
                                              max_trailing_padding_zeroes_in_precision_mode_ = 0;
                                              local_188.min_exponent_width_ = 0;
                                              local_260.position_ = 0;
                                              bVar1 = double_conversion::DoubleToStringConverter::
                                                      ToFixed(&local_188,0.0,0,&local_260);
                                              pbVar8 = (byte *)local_260.buffer_.start_;
                                              if (bVar1) {
                                                local_260.buffer_.start_[local_260.position_] = 0;
                                                local_260.position_ = -1;
                                                if ((byte *)local_260.buffer_.start_ == (byte *)0x0)
                                                goto LAB_0082fc59;
                                                iVar2 = strcmp("0.0",local_260.buffer_.start_);
                                                if (iVar2 != 0) {
                                                  pcVar4 = "\"0.0\"";
                                                  pcVar6 = "0.0";
                                                  uVar5 = 0x252;
                                                  goto LAB_00830cbd;
                                                }
                                                local_260.position_ = 0;
                                                bVar1 = double_conversion::DoubleToStringConverter::
                                                        ToFixed(&local_188,-0.0,0,&local_260);
                                                pbVar8 = (byte *)local_260.buffer_.start_;
                                                if (bVar1) {
                                                  local_260.buffer_.start_[local_260.position_] = 0;
                                                  local_260.position_ = -1;
                                                  if ((byte *)local_260.buffer_.start_ ==
                                                      (byte *)0x0) goto LAB_0082fc59;
                                                  iVar2 = strcmp("-0.0",local_260.buffer_.start_);
                                                  if (iVar2 != 0) {
                                                    pcVar4 = "\"-0.0\"";
                                                    pcVar6 = "-0.0";
                                                    uVar5 = 0x256;
                                                    goto LAB_00830cbd;
                                                  }
                                                  local_260.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToFixed(&local_188,1.0,0,&local_260);
                                                  pbVar8 = (byte *)local_260.buffer_.start_;
                                                  if (bVar1) {
                                                    local_260.buffer_.start_[local_260.position_] =
                                                         0;
                                                    local_260.position_ = -1;
                                                    if ((byte *)local_260.buffer_.start_ ==
                                                        (byte *)0x0) goto LAB_0082fc59;
                                                    iVar2 = strcmp("1.0",local_260.buffer_.start_);
                                                    if (iVar2 != 0) {
                                                      pcVar4 = "\"1.0\"";
                                                      pcVar6 = "1.0";
                                                      uVar5 = 0x25a;
                                                      goto LAB_00830cbd;
                                                    }
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_188,-1.0,0,&local_260)
                                                    ;
                                                    pbVar8 = (byte *)local_260.buffer_.start_;
                                                    if (bVar1) {
                                                      local_260.buffer_.start_[local_260.position_]
                                                           = 0;
                                                      local_260.position_ = -1;
                                                      if ((byte *)local_260.buffer_.start_ ==
                                                          (byte *)0x0) goto LAB_0082fc59;
                                                      iVar2 = strcmp("-1.0",local_260.buffer_.start_
                                                                    );
                                                      if (iVar2 != 0) {
                                                        pcVar4 = "\"-1.0\"";
                                                        pcVar6 = "-1.0";
                                                        uVar5 = 0x25e;
                                                        goto LAB_00830cbd;
                                                      }
                                                      local_218.flags_ = 0;
                                                      local_218.infinity_symbol_ = (char *)0x0;
                                                      local_218.nan_symbol_ = (char *)0x0;
                                                      local_218.exponent_character_ = 'e';
                                                      local_218.decimal_in_shortest_low_ = 0;
                                                      local_218.decimal_in_shortest_high_ = 0;
                                                      local_218.
                                                      max_leading_padding_zeroes_in_precision_mode_
                                                           = 0;
                                                      local_218.
                                                      max_trailing_padding_zeroes_in_precision_mode_
                                                           = 0;
                                                      local_218.min_exponent_width_ = 0;
                                                      local_260.position_ = 0;
                                                      bVar1 = double_conversion::
                                                              DoubleToStringConverter::ToFixed
                                                                        (&local_218,3.12,1,
                                                                         &local_260);
                                                      pbVar8 = (byte *)local_260.buffer_.start_;
                                                      if (bVar1) {
                                                        local_260.buffer_.start_
                                                        [local_260.position_] = 0;
                                                        local_260.position_ = -1;
                                                        if ((byte *)local_260.buffer_.start_ ==
                                                            (byte *)0x0) goto LAB_0082fc59;
                                                        iVar2 = strcmp("3.1",local_260.buffer_.
                                                                             start_);
                                                        if (iVar2 != 0) {
                                                          pcVar4 = "\"3.1\"";
                                                          pcVar6 = "3.1";
                                                          uVar5 = 0x266;
                                                          goto LAB_00830cbd;
                                                        }
                                                        local_260.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::ToFixed
                                                                          (&local_218,3.1415,3,
                                                                           &local_260);
                                                        pbVar8 = (byte *)local_260.buffer_.start_;
                                                        if (bVar1) {
                                                          local_260.buffer_.start_
                                                          [local_260.position_] = 0;
                                                          local_260.position_ = -1;
                                                          if ((byte *)local_260.buffer_.start_ ==
                                                              (byte *)0x0) goto LAB_0082fc59;
                                                          iVar2 = strcmp("3.142",local_260.buffer_.
                                                                                 start_);
                                                          if (iVar2 != 0) {
                                                            pcVar4 = "\"3.142\"";
                                                            pcVar6 = "3.142";
                                                            uVar5 = 0x26a;
                                                            goto LAB_00830cbd;
                                                          }
                                                          local_260.position_ = 0;
                                                          bVar1 = double_conversion::
                                                                  DoubleToStringConverter::ToFixed
                                                                            (&local_218,1234.56789,4
                                                                             ,&local_260);
                                                          pbVar8 = (byte *)local_260.buffer_.start_;
                                                          if (bVar1) {
                                                            local_260.buffer_.start_
                                                            [local_260.position_] = 0;
                                                            local_260.position_ = -1;
                                                            if ((byte *)local_260.buffer_.start_ ==
                                                                (byte *)0x0) goto LAB_0082fc59;
                                                            iVar2 = strcmp("1234.5679",
                                                                           local_260.buffer_.start_)
                                                            ;
                                                            if (iVar2 != 0) {
                                                              pcVar4 = "\"1234.5679\"";
                                                              pcVar6 = "1234.5679";
                                                              uVar5 = 0x26e;
                                                              goto LAB_00830cbd;
                                                            }
                                                            local_260.position_ = 0;
                                                            bVar1 = double_conversion::
                                                                    DoubleToStringConverter::ToFixed
                                                                              (&local_218,1.23,5,
                                                                               &local_260);
                                                            pbVar8 = (byte *)local_260.buffer_.
                                                                             start_;
                                                            if (bVar1) {
                                                              local_260.buffer_.start_
                                                              [local_260.position_] = 0;
                                                              local_260.position_ = -1;
                                                              if ((byte *)local_260.buffer_.start_
                                                                  == (byte *)0x0) goto LAB_0082fc59;
                                                              iVar2 = strcmp("1.23000",
                                                                             local_260.buffer_.
                                                                             start_);
                                                              if (iVar2 != 0) {
                                                                pcVar4 = "\"1.23000\"";
                                                                pcVar6 = "1.23000";
                                                                uVar5 = 0x272;
                                                                goto LAB_00830cbd;
                                                              }
                                                              local_260.position_ = 0;
                                                              bVar1 = double_conversion::
                                                                      DoubleToStringConverter::
                                                                      ToFixed(&local_218,0.1,4,
                                                                              &local_260);
                                                              pbVar8 = (byte *)local_260.buffer_.
                                                                               start_;
                                                              if (bVar1) {
                                                                local_260.buffer_.start_
                                                                [local_260.position_] = 0;
                                                                local_260.position_ = -1;
                                                                if ((byte *)local_260.buffer_.start_
                                                                    == (byte *)0x0)
                                                                goto LAB_0082fc59;
                                                                iVar2 = strcmp("0.1000",local_260.
                                                                                        buffer_.
                                                  start_);
                                                  if (iVar2 != 0) {
                                                    pcVar4 = "\"0.1000\"";
                                                    pcVar6 = "0.1000";
                                                    uVar5 = 0x276;
                                                    goto LAB_00830cbd;
                                                  }
                                                  local_260.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToFixed(&local_218,1e+30,2,&local_260);
                                                  pbVar8 = (byte *)local_260.buffer_.start_;
                                                  if (bVar1) {
                                                    local_260.buffer_.start_[local_260.position_] =
                                                         0;
                                                    local_260.position_ = -1;
                                                    if ((byte *)local_260.buffer_.start_ ==
                                                        (byte *)0x0) goto LAB_0082fc59;
                                                    iVar2 = strcmp(
                                                  "1000000000000000019884624838656.00",
                                                  local_260.buffer_.start_);
                                                  if (iVar2 != 0) {
                                                    pcVar4 = 
                                                  "\"1000000000000000019884624838656.00\"";
                                                  pcVar6 = "1000000000000000019884624838656.00";
                                                  uVar5 = 0x27a;
                                                  goto LAB_00830cbd;
                                                  }
                                                  local_260.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToFixed(&local_218,0.1,0x1e,&local_260);
                                                  pbVar8 = (byte *)local_260.buffer_.start_;
                                                  if (bVar1) {
                                                    local_260.buffer_.start_[local_260.position_] =
                                                         0;
                                                    local_260.position_ = -1;
                                                    if ((byte *)local_260.buffer_.start_ ==
                                                        (byte *)0x0) goto LAB_0082fc59;
                                                    iVar2 = strcmp(
                                                  "0.100000000000000005551115123126",
                                                  local_260.buffer_.start_);
                                                  if (iVar2 != 0) {
                                                    pcVar4 = "\"0.100000000000000005551115123126\"";
                                                    pcVar6 = "0.100000000000000005551115123126";
                                                    uVar5 = 0x27e;
                                                    goto LAB_00830cbd;
                                                  }
                                                  local_260.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToFixed(&local_218,0.1,0x11,&local_260);
                                                  pbVar8 = (byte *)local_260.buffer_.start_;
                                                  if (bVar1) {
                                                    local_260.buffer_.start_[local_260.position_] =
                                                         0;
                                                    local_260.position_ = -1;
                                                    if ((byte *)local_260.buffer_.start_ ==
                                                        (byte *)0x0) goto LAB_0082fc59;
                                                    iVar2 = strcmp("0.10000000000000001",
                                                                   local_260.buffer_.start_);
                                                    if (iVar2 != 0) {
                                                      pcVar4 = "\"0.10000000000000001\"";
                                                      pcVar6 = "0.10000000000000001";
                                                      uVar5 = 0x282;
                                                      goto LAB_00830cbd;
                                                    }
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_218,123.45,0,
                                                                       &local_260);
                                                    pbVar8 = (byte *)local_260.buffer_.start_;
                                                    if (bVar1) {
                                                      local_260.buffer_.start_[local_260.position_]
                                                           = 0;
                                                      local_260.position_ = -1;
                                                      if ((byte *)local_260.buffer_.start_ ==
                                                          (byte *)0x0) goto LAB_0082fc59;
                                                      iVar2 = strcmp("123",local_260.buffer_.start_)
                                                      ;
                                                      if (iVar2 != 0) {
                                                        pcVar4 = "\"123\"";
                                                        pcVar6 = "123";
                                                        uVar5 = 0x286;
                                                        goto LAB_00830cbd;
                                                      }
                                                      local_260.position_ = 0;
                                                      bVar1 = double_conversion::
                                                              DoubleToStringConverter::ToFixed
                                                                        (&local_218,0.678,0,
                                                                         &local_260);
                                                      if (bVar1) {
                                                        local_260.buffer_.start_
                                                        [local_260.position_] = 0;
                                                        local_260.position_ = -1;
                                                        if ((byte *)local_260.buffer_.start_ ==
                                                            (byte *)0x0) goto LAB_0082fc59;
                                                        uVar3 = (byte)*local_260.buffer_.start_ -
                                                                0x31;
                                                        if (uVar3 == 0) {
                                                          uVar3 = (uint)(byte)local_260.buffer_.
                                                                              start_[1];
                                                        }
                                                        if (uVar3 != 0) {
                                                          pcVar4 = "\"1\"";
                                                          pcVar6 = "1";
                                                          uVar5 = 0x28a;
                                                          pbVar8 = (byte *)local_260.buffer_.start_;
                                                          goto LAB_00830cbd;
                                                        }
                                                        local_f8.flags_ = 2;
                                                        local_f8.infinity_symbol_ = (char *)0x0;
                                                        local_f8.nan_symbol_ = (char *)0x0;
                                                        local_f8.exponent_character_ = 'e';
                                                        local_f8.decimal_in_shortest_low_ = 0;
                                                        local_f8.decimal_in_shortest_high_ = 0;
                                                        local_f8.
                                                  max_leading_padding_zeroes_in_precision_mode_ = 0;
                                                  local_f8.
                                                  max_trailing_padding_zeroes_in_precision_mode_ = 0
                                                  ;
                                                  local_f8.min_exponent_width_ = 0;
                                                  local_260.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToFixed(&local_f8,123.45,0,&local_260);
                                                  pbVar8 = (byte *)local_260.buffer_.start_;
                                                  if (bVar1) {
                                                    local_260.buffer_.start_[local_260.position_] =
                                                         0;
                                                    local_260.position_ = -1;
                                                    if ((byte *)local_260.buffer_.start_ ==
                                                        (byte *)0x0) goto LAB_0082fc59;
                                                    iVar2 = strcmp("123.",local_260.buffer_.start_);
                                                    if (iVar2 != 0) {
                                                      pcVar4 = "\"123.\"";
                                                      pcVar6 = "123.";
                                                      uVar5 = 0x291;
                                                      goto LAB_00830cbd;
                                                    }
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_f8,0.678,0,&local_260)
                                                    ;
                                                    if (bVar1) {
                                                      local_260.buffer_.start_[local_260.position_]
                                                           = 0;
                                                      local_260.position_ = -1;
                                                      if ((byte *)local_260.buffer_.start_ ==
                                                          (byte *)0x0) goto LAB_0082fc59;
                                                      uVar3 = (byte)*local_260.buffer_.start_ - 0x31
                                                      ;
                                                      if ((uVar3 == 0) &&
                                                         (uVar3 = (byte)local_260.buffer_.start_[1]
                                                                  - 0x2e, uVar3 == 0)) {
                                                        uVar3 = (uint)(byte)local_260.buffer_.start_
                                                                            [2];
                                                      }
                                                      if (uVar3 != 0) {
                                                        pcVar4 = "\"1.\"";
                                                        pcVar6 = "1.";
                                                        uVar5 = 0x295;
                                                        pbVar8 = (byte *)local_260.buffer_.start_;
                                                        goto LAB_00830cbd;
                                                      }
                                                      local_128.flags_ = 6;
                                                      local_128.infinity_symbol_ = (char *)0x0;
                                                      local_128.nan_symbol_ = (char *)0x0;
                                                      local_128.exponent_character_ = 'e';
                                                      local_128.decimal_in_shortest_low_ = 0;
                                                      local_128.decimal_in_shortest_high_ = 0;
                                                      local_128.
                                                      max_leading_padding_zeroes_in_precision_mode_
                                                           = 0;
                                                      local_128.
                                                      max_trailing_padding_zeroes_in_precision_mode_
                                                           = 0;
                                                      local_128.min_exponent_width_ = 0;
                                                      local_260.position_ = 0;
                                                      bVar1 = double_conversion::
                                                              DoubleToStringConverter::ToFixed
                                                                        (&local_128,123.45,0,
                                                                         &local_260);
                                                      pbVar8 = (byte *)local_260.buffer_.start_;
                                                      if (bVar1) {
                                                        local_260.buffer_.start_
                                                        [local_260.position_] = 0;
                                                        local_260.position_ = -1;
                                                        if ((byte *)local_260.buffer_.start_ ==
                                                            (byte *)0x0) goto LAB_0082fc59;
                                                        iVar2 = strcmp("123.0",local_260.buffer_.
                                                                               start_);
                                                        if (iVar2 != 0) {
                                                          pcVar4 = "\"123.0\"";
                                                          pcVar6 = "123.0";
                                                          uVar5 = 0x29d;
                                                          goto LAB_00830cbd;
                                                        }
                                                        local_260.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::ToFixed
                                                                          (&local_128,0.678,0,
                                                                           &local_260);
                                                        pbVar8 = (byte *)local_260.buffer_.start_;
                                                        if (bVar1) {
                                                          local_260.buffer_.start_
                                                          [local_260.position_] = 0;
                                                          local_260.position_ = -1;
                                                          if ((byte *)local_260.buffer_.start_ ==
                                                              (byte *)0x0) goto LAB_0082fc59;
                                                          iVar2 = strcmp("1.0",local_260.buffer_.
                                                                               start_);
                                                          if (iVar2 != 0) {
                                                            pcVar4 = "\"1.0\"";
                                                            pcVar6 = "1.0";
                                                            uVar5 = 0x2a1;
                                                            goto LAB_00830cbd;
                                                          }
                                                          local_1b8.flags_ = 6;
                                                          local_1b8.infinity_symbol_ = (char *)0x0;
                                                          local_1b8.nan_symbol_ = (char *)0x0;
                                                          local_1b8.exponent_character_ = 'e';
                                                          local_1b8.decimal_in_shortest_low_ = 0;
                                                          local_1b8.decimal_in_shortest_high_ = 0;
                                                          local_1b8.
                                                                                                                    
                                                  max_leading_padding_zeroes_in_precision_mode_ = 0;
                                                  local_1b8.
                                                  max_trailing_padding_zeroes_in_precision_mode_ = 0
                                                  ;
                                                  local_1b8.min_exponent_width_ = 0;
                                                  local_260.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToFixed(&local_1b8,INFINITY,1,&local_260
                                                                   );
                                                  if (bVar1) {
                                                    pcVar4 = 
                                                  "!dc8.ToFixed(Double::Infinity(), 1, &builder)";
                                                  uVar5 = 0x2a7;
                                                  }
                                                  else {
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_1b8,-INFINITY,1,
                                                                       &local_260);
                                                    if (bVar1) {
                                                      pcVar4 = 
                                                  "!dc8.ToFixed(-Double::Infinity(), 1, &builder)";
                                                  uVar5 = 0x2aa;
                                                  }
                                                  else {
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_1b8,NAN,1,&local_260);
                                                    if (bVar1) {
                                                      pcVar4 = 
                                                  "!dc8.ToFixed(Double::NaN(), 1, &builder)";
                                                  uVar5 = 0x2ad;
                                                  }
                                                  else {
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_1b8,-NAN,1,&local_260)
                                                    ;
                                                    if (bVar1) {
                                                      pcVar4 = 
                                                  "!dc8.ToFixed(-Double::NaN(), 1, &builder)";
                                                  uVar5 = 0x2b0;
                                                  }
                                                  else {
                                                    local_1e8.flags_ = 6;
                                                    local_1e8.infinity_symbol_ = "Infinity";
                                                    local_1e8.nan_symbol_ = "NaN";
                                                    local_1e8.exponent_character_ = 'e';
                                                    local_1e8.decimal_in_shortest_low_ = 0;
                                                    local_1e8.decimal_in_shortest_high_ = 0;
                                                    local_1e8.
                                                    max_leading_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_1e8.
                                                    max_trailing_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_1e8.min_exponent_width_ = 0;
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_1e8,INFINITY,1,
                                                                       &local_260);
                                                    pbVar8 = (byte *)local_260.buffer_.start_;
                                                    if (bVar1) {
                                                      local_260.buffer_.start_[local_260.position_]
                                                           = 0;
                                                      local_260.position_ = -1;
                                                      if ((byte *)local_260.buffer_.start_ ==
                                                          (byte *)0x0) goto LAB_0082fc59;
                                                      iVar2 = strcmp("Infinity",
                                                                     local_260.buffer_.start_);
                                                      if (iVar2 == 0) {
                                                        local_260.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::ToFixed
                                                                          (&local_1e8,-INFINITY,1,
                                                                           &local_260);
                                                        pbVar8 = (byte *)local_260.buffer_.start_;
                                                        if (!bVar1) {
                                                          pcVar4 = 
                                                  "dc9.ToFixed(-Double::Infinity(), 1, &builder)";
                                                  uVar5 = 0x2b9;
                                                  goto LAB_00830c85;
                                                  }
                                                  local_260.buffer_.start_[local_260.position_] = 0;
                                                  local_260.position_ = -1;
                                                  if ((byte *)local_260.buffer_.start_ ==
                                                      (byte *)0x0) goto LAB_0082fc59;
                                                  iVar2 = strcmp("-Infinity",
                                                                 local_260.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_1e8,NAN,1,&local_260);
                                                    pbVar8 = (byte *)local_260.buffer_.start_;
                                                    if (!bVar1) {
                                                      pcVar4 = 
                                                  "dc9.ToFixed(Double::NaN(), 1, &builder)";
                                                  uVar5 = 0x2bd;
                                                  goto LAB_00830c85;
                                                  }
                                                  local_260.buffer_.start_[local_260.position_] = 0;
                                                  local_260.position_ = -1;
                                                  if ((byte *)local_260.buffer_.start_ ==
                                                      (byte *)0x0) goto LAB_0082fc59;
                                                  iVar2 = strcmp("NaN",local_260.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    local_260.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::ToFixed
                                                                      (&local_1e8,-NAN,1,&local_260)
                                                    ;
                                                    pbVar8 = (byte *)local_260.buffer_.start_;
                                                    if (!bVar1) {
                                                      pcVar4 = 
                                                  "dc9.ToFixed(-Double::NaN(), 1, &builder)";
                                                  uVar5 = 0x2c1;
                                                  goto LAB_00830c85;
                                                  }
                                                  local_260.buffer_.start_[local_260.position_] = 0;
                                                  local_260.position_ = -1;
                                                  if ((byte *)local_260.buffer_.start_ ==
                                                      (byte *)0x0) goto LAB_0082fc59;
                                                  iVar2 = strcmp("NaN",local_260.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    return;
                                                  }
                                                  pcVar4 = "\"NaN\"";
                                                  pcVar6 = "NaN";
                                                  uVar5 = 0x2c2;
                                                  }
                                                  else {
                                                    pcVar4 = "\"NaN\"";
                                                    pcVar6 = "NaN";
                                                    uVar5 = 0x2be;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "\"-Infinity\"";
                                                    pcVar6 = "-Infinity";
                                                    uVar5 = 0x2ba;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "\"Infinity\"";
                                                    pcVar6 = "Infinity";
                                                    uVar5 = 0x2b6;
                                                  }
                                                  goto LAB_00830cbd;
                                                  }
                                                  pcVar4 = 
                                                  "dc9.ToFixed(Double::Infinity(), 1, &builder)";
                                                  uVar5 = 0x2b5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc7.ToFixed(0.678, 0, &builder)";
                                                    uVar5 = 0x2a0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc7.ToFixed(123.45, 0, &builder)";
                                                    uVar5 = 0x29c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc6.ToFixed(0.678, 0, &builder)";
                                                    uVar5 = 0x294;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc6.ToFixed(123.45, 0, &builder)";
                                                    uVar5 = 0x290;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(0.678, 0, &builder)";
                                                    uVar5 = 0x289;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(123.45, 0, &builder)";
                                                    uVar5 = 0x285;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(0.1, 17, &builder)";
                                                    uVar5 = 0x281;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(0.1, 30, &builder)";
                                                    uVar5 = 0x27d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(1e30, 2, &builder)";
                                                    uVar5 = 0x279;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(0.1, 4, &builder)";
                                                    uVar5 = 0x275;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(1.23, 5, &builder)";
                                                    uVar5 = 0x271;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(1234.56789, 4, &builder)";
                                                    uVar5 = 0x26d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(3.1415, 3, &builder)";
                                                    uVar5 = 0x269;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc5.ToFixed(3.12, 1, &builder)";
                                                    uVar5 = 0x265;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc4.ToFixed(-1.0, 0, &builder)";
                                                    uVar5 = 0x25d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "dc4.ToFixed(1.0, 0, &builder)";
                                                    uVar5 = 0x259;
                                                  }
                                                }
                                                else {
                                                  pcVar4 = "dc4.ToFixed(-0.0, 0, &builder)";
                                                  uVar5 = 0x255;
                                                }
                                              }
                                              else {
                                                pcVar4 = "dc4.ToFixed(0.0, 0, &builder)";
                                                uVar5 = 0x251;
                                              }
                                            }
                                            else {
                                              pcVar4 = "dc3.ToFixed(-1.0, 0, &builder)";
                                              uVar5 = 0x246;
                                            }
                                          }
                                          else {
                                            pcVar4 = "dc3.ToFixed(1.0, 0, &builder)";
                                            uVar5 = 0x242;
                                          }
                                        }
                                        else {
                                          pcVar4 = "dc3.ToFixed(-0.0, 0, &builder)";
                                          uVar5 = 0x23e;
                                        }
                                      }
                                      else {
                                        pcVar4 = "dc3.ToFixed(0.0, 0, &builder)";
                                        uVar5 = 0x23a;
                                      }
                                    }
                                    else {
                                      pcVar4 = "dc2.ToFixed(-0.0, 1, &builder)";
                                      uVar5 = 0x231;
                                    }
                                  }
                                  else {
                                    pcVar4 = "dc2.ToFixed(0.0, 1, &builder)";
                                    uVar5 = 0x22d;
                                  }
                                }
                                else {
                                  pcVar4 = "dc.ToFixed(0.55, 1, &builder)";
                                  uVar5 = 0x225;
                                }
                              }
                              else {
                                pcVar4 = "dc.ToFixed(0.45, 1, &builder)";
                                uVar5 = 0x221;
                              }
                            }
                            else {
                              pcVar4 = "dc.ToFixed(0.35, 1, &builder)";
                              uVar5 = 0x21d;
                            }
                          }
                          else {
                            pcVar4 = "dc.ToFixed(0.25, 1, &builder)";
                            uVar5 = 0x219;
                          }
                        }
                        else {
                          pcVar4 = "dc.ToFixed(0.15, 1, &builder)";
                          uVar5 = 0x215;
                        }
                      }
                      else {
                        pcVar4 = "dc.ToFixed(3.5, 0, &builder)";
                        uVar5 = 0x211;
                      }
                    }
                    else {
                      pcVar4 = "dc.ToFixed(2.5, 0, &builder)";
                      uVar5 = 0x20d;
                    }
                  }
                  else {
                    pcVar4 = "dc.ToFixed(1.5, 0, &builder)";
                    uVar5 = 0x209;
                  }
                }
                else {
                  pcVar4 = "dc.ToFixed(0.0000373, 2, &builder)";
                  uVar5 = 0x205;
                }
              }
              else {
                pcVar4 = "dc.ToFixed(0.0373, 2, &builder)";
                uVar5 = 0x201;
              }
            }
            else {
              pcVar4 = "dc.ToFixed(0.0323, 2, &builder)";
              uVar5 = 0x1fd;
            }
          }
          else {
            pcVar4 = "dc.ToFixed(3.23, 3, &builder)";
            uVar5 = 0x1f9;
          }
        }
        else {
          pcVar4 = "dc.ToFixed(3.23, 1, &builder)";
          uVar5 = 0x1f5;
        }
      }
      else {
        pcVar4 = "dc.ToFixed(3.0, 0, &builder)";
        uVar5 = 0x1f1;
      }
    }
  }
LAB_00830c85:
  printf("%s:%d:\n CHECK(%s) failed\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar5,pcVar4);
  abort();
}

Assistant:

TEST(DoubleToFixed) {
  const int kBufferSize = 128;
  char buffer[kBufferSize];
  StringBuilder builder(buffer, kBufferSize);
  int flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::UNIQUE_ZERO;
  DoubleToStringConverter dc(flags, "Infinity", "NaN", 'e',
                             0, 0, 0, 0);  // Padding zeroes.

  CHECK(dc.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxFixedDigitsBeforePoint == 60);
  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxFixedDigitsAfterPoint == 60);
  builder.Reset();
  CHECK(dc.ToFixed(
      0.0, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("0.000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(
      9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("899999999999999918767229449717619953810131273674690656206848."
           "000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(
      -9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("-899999999999999918767229449717619953810131273674690656206848."
           "000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(!dc.ToFixed(
      1e60, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ(0, builder.position());

  builder.Reset();
  CHECK(!dc.ToFixed(
      9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint + 1, &builder));
  CHECK_EQ(0, builder.position());

  builder.Reset();
  CHECK(dc.ToFixed(3.0, 0, &builder));
  CHECK_EQ("3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.23, 1, &builder));
  CHECK_EQ("3.2", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.23, 3, &builder));
  CHECK_EQ("3.230", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0323, 2, &builder));
  CHECK_EQ("0.03", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0373, 2, &builder));
  CHECK_EQ("0.04", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0000373, 2, &builder));
  CHECK_EQ("0.00", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(1.5, 0, &builder));
  CHECK_EQ("2", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(2.5, 0, &builder));
  CHECK_EQ("3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.5, 0, &builder));
  CHECK_EQ("4", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.15, 1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.25, 1, &builder));
  CHECK_EQ("0.3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.35, 1, &builder));
  CHECK_EQ("0.3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.45, 1, &builder));
  CHECK_EQ("0.5", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.55, 1, &builder));
  CHECK_EQ("0.6", builder.Finalize());

  // Test positive/negative zeroes.
  int flags2 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc2(flags2, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc2.ToFixed(0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("-0.0", builder.Finalize());

  // Verify the trailing dot is emitted.
  int flags3 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT;
  DoubleToStringConverter dc3(flags3, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc3.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("-0.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(1.0, 0, &builder));
  CHECK_EQ("1.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(-1.0, 0, &builder));
  CHECK_EQ("-1.", builder.Finalize());

  // Verify no trailing zero is emitted, even if the configuration is set.
  // The given parameter takes precedence.
  int flags4 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc4(flags4, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc4.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("-0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(1.0, 0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(-1.0, 0, &builder));
  CHECK_EQ("-1.0", builder.Finalize());

  // Test the examples in the comments of ToFixed.
  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc5(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc5.ToFixed(3.12, 1, &builder));
  CHECK_EQ("3.1", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(3.1415, 3, &builder));
  CHECK_EQ("3.142", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1234.56789, 4, &builder));
  CHECK_EQ("1234.5679", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1.23, 5, &builder));
  CHECK_EQ("1.23000", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 4, &builder));
  CHECK_EQ("0.1000", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1e30, 2, &builder));
  CHECK_EQ("1000000000000000019884624838656.00", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 30, &builder));
  CHECK_EQ("0.100000000000000005551115123126", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 17, &builder));
  CHECK_EQ("0.10000000000000001", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT;
  DoubleToStringConverter dc6(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc6.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123.", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1.", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc7(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc7.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123.0", builder.Finalize());

  builder.Reset();
  CHECK(dc7.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc8(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc8.ToFixed(Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(-Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(Double::NaN(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(-Double::NaN(), 1, &builder));

  DoubleToStringConverter dc9(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc9.ToFixed(Double::Infinity(), 1, &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(-Double::Infinity(), 1, &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(-Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());
}